

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  uint uVar1;
  int iVar2;
  xmlEntityPtr pxVar3;
  xmlHashTablePtr pxVar4;
  bool bVar5;
  xmlChar local_78;
  char cStack_77;
  undefined2 uStack_76;
  xmlChar local_74;
  char cStack_73;
  undefined2 uStack_72;
  xmlChar ref_1 [4];
  xmlChar ref [4];
  xmlChar *hex;
  int c;
  int valid;
  xmlEntityPtr predef;
  xmlEntityPtr ret;
  xmlEntitiesTablePtr table;
  xmlDictPtr dict;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  
  table = (xmlEntitiesTablePtr)0x0;
  ret = (xmlEntityPtr)0x0;
  if (name == (xmlChar *)0x0) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else if (dtd == (xmlDtdPtr)0x0) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else {
    if (dtd->doc != (_xmlDoc *)0x0) {
      table = (xmlEntitiesTablePtr)dtd->doc->dict;
    }
    if (type - 1U < 3) {
      pxVar3 = xmlGetPredefinedEntity(name);
      if (pxVar3 != (xmlEntityPtr)0x0) {
        bVar5 = false;
        if ((type == 1) && (content != (xmlChar *)0x0)) {
          uVar1 = (uint)*pxVar3->content;
          if (((*content == uVar1) && (content[1] == '\0')) &&
             (((uVar1 == 0x3e || (uVar1 == 0x27)) || (uVar1 == 0x22)))) {
            bVar5 = true;
          }
          else if ((*content == '&') && (content[1] == '#')) {
            if (content[2] == 'x') {
              _ref_1 = "0123456789ABCDEF";
              _local_74 = CONCAT22(0x3b,CONCAT11("0123456789ABCDEF"[(int)(uVar1 % 0x10)],
                                                 "0123456789ABCDEF"
                                                 [(int)(((ulong)(long)(int)uVar1 / 0x10) % 0x10)]));
              iVar2 = xmlStrcasecmp(content + 3,&local_74);
              bVar5 = iVar2 == 0;
            }
            else {
              _local_78 = CONCAT22(0x3b,CONCAT11(*pxVar3->content % 10 + 0x30,
                                                 (char)(((ulong)(long)(int)uVar1 / 10) % 10) + '0'))
              ;
              iVar2 = xmlStrEqual(content + 2,&local_78);
              bVar5 = iVar2 != 0;
            }
          }
        }
        if (!bVar5) {
          xmlEntitiesWarn(XML_ERR_ENTITY_PROCESSING,
                          "xmlAddEntity: invalid redeclaration of predefined entity \'%s\'",name);
          return (xmlEntityPtr)0x0;
        }
      }
      if (dtd->entities == (void *)0x0) {
        pxVar4 = xmlHashCreateDict(0,(xmlDictPtr)table);
        dtd->entities = pxVar4;
      }
      ret = (xmlEntityPtr)dtd->entities;
    }
    else if (type - 4U < 2) {
      if (dtd->pentities == (void *)0x0) {
        pxVar4 = xmlHashCreateDict(0,(xmlDictPtr)table);
        dtd->pentities = pxVar4;
      }
      ret = (xmlEntityPtr)dtd->pentities;
    }
    else if (type == 6) {
      return (xmlEntityPtr)0x0;
    }
    if (ret == (xmlEntityPtr)0x0) {
      dtd_local = (xmlDtdPtr)0x0;
    }
    else {
      dtd_local = (xmlDtdPtr)
                  xmlCreateEntity((xmlDictPtr)table,name,type,ExternalID,SystemID,content);
      if ((xmlEntityPtr)dtd_local == (xmlEntityPtr)0x0) {
        dtd_local = (xmlDtdPtr)0x0;
      }
      else {
        ((xmlEntityPtr)dtd_local)->doc = dtd->doc;
        iVar2 = xmlHashAddEntry((xmlHashTablePtr)ret,name,dtd_local);
        if (iVar2 != 0) {
          xmlFreeEntity((xmlEntityPtr)dtd_local);
          dtd_local = (xmlDtdPtr)0x0;
        }
      }
    }
  }
  return (xmlEntityPtr)dtd_local;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid) {
                    xmlEntitiesWarn(XML_ERR_ENTITY_PROCESSING,
                            "xmlAddEntity: invalid redeclaration of predefined"
                            " entity '%s'", name);
                    return(NULL);
                }
            }
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}